

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O0

CK_RV SymEncryptUpdate(Session *session,CK_BYTE_PTR pData,CK_ULONG ulDataLen,
                      CK_BYTE_PTR pEncryptedData,CK_ULONG_PTR pulEncryptedDataLen)

{
  ulong uVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  size_t sVar5;
  size_t sVar6;
  uchar *__src;
  void *in_RCX;
  long in_RDX;
  Session *in_RDI;
  ulong *in_R8;
  ByteString encryptedData;
  ByteString data;
  int nrOfBlocks;
  CK_ULONG maxSize;
  size_t remainingSize;
  size_t blockSize;
  SymmetricAlgorithm *cipher;
  ByteString *this;
  Session *in_stack_fffffffffffffea0;
  Session *this_00;
  long lVar7;
  size_t in_stack_fffffffffffffeb0;
  ulong uVar8;
  uchar *in_stack_fffffffffffffeb8;
  ByteString *in_stack_fffffffffffffec0;
  undefined1 local_b0 [40];
  undefined1 local_88 [44];
  int local_5c;
  ulong local_58;
  long local_50;
  Session *local_48;
  SymmetricAlgorithm *local_40;
  ulong *local_38;
  void *local_30;
  long local_28;
  Session *local_18;
  CK_RV local_10;
  
  local_38 = in_R8;
  local_30 = in_RCX;
  local_28 = in_RDX;
  local_18 = in_RDI;
  local_40 = Session::getSymmetricCryptoOp(in_RDI);
  if ((local_40 == (SymmetricAlgorithm *)0x0) ||
     (bVar2 = Session::getAllowMultiPartOp(local_18), !bVar2)) {
    Session::resetOp(in_stack_fffffffffffffea0);
    local_10 = 0x91;
  }
  else {
    iVar3 = (*local_40->_vptr_SymmetricAlgorithm[0xd])();
    local_48 = (Session *)CONCAT44(extraout_var,iVar3);
    iVar3 = (*local_40->_vptr_SymmetricAlgorithm[0x10])();
    local_50 = CONCAT44(extraout_var_00,iVar3);
    local_58 = local_28 + local_50;
    uVar4 = (*local_40->_vptr_SymmetricAlgorithm[0x13])();
    if ((uVar4 & 1) != 0) {
      local_5c = (int)((ulong)(local_28 + local_50) / (ulong)local_48);
      local_58 = (long)local_5c * (long)local_48;
    }
    uVar4 = (*local_40->_vptr_SymmetricAlgorithm[0x14])(local_40,local_28);
    if ((uVar4 & 1) == 0) {
      Session::resetOp(in_stack_fffffffffffffea0);
      local_10 = 0x21;
    }
    else if (local_30 == (void *)0x0) {
      *local_38 = local_58;
      local_10 = 0;
    }
    else if (*local_38 < local_58) {
      softHSMLog(7,"SymEncryptUpdate",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                 ,0xa9f,
                 "ulDataLen: %#5x  output buffer size: %#5x  blockSize: %#3x  remainingSize: %#4x  maxSize: %#5x"
                 ,local_28,*local_38,local_48,local_50,local_58);
      *local_38 = local_58;
      local_10 = 0x150;
    }
    else {
      ByteString::ByteString
                (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
      ByteString::ByteString((ByteString *)0x1685de);
      uVar4 = (*local_40->_vptr_SymmetricAlgorithm[3])(local_40,local_88,local_b0);
      this_00 = local_48;
      lVar7 = local_50;
      uVar8 = local_58;
      if ((uVar4 & 1) == 0) {
        Session::resetOp(in_stack_fffffffffffffea0);
        local_10 = 5;
      }
      else {
        this = (ByteString *)*local_38;
        sVar5 = ByteString::size((ByteString *)0x1686db);
        softHSMLog(7,"SymEncryptUpdate",
                   "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                   ,0xaaf,
                   "ulDataLen: %#5x  output buffer size: %#5x  blockSize: %#3x  remainingSize: %#4x  maxSize: %#5x  encryptedData.size(): %#5x"
                   ,local_28,this,this_00,lVar7,uVar8,sVar5);
        uVar1 = *local_38;
        sVar6 = ByteString::size((ByteString *)0x16876a);
        if (uVar1 < sVar6) {
          Session::resetOp(this_00);
          uVar1 = *local_38;
          sVar6 = ByteString::size((ByteString *)0x1687b0);
          softHSMLog(3,"SymEncryptUpdate",
                     "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                     ,0xab6,
                     "EncryptUpdate returning too much data. Length of output data buffer is %i but %i bytes was returned by the encrypt."
                     ,uVar1,sVar6,this_00,lVar7,uVar8,sVar5);
          local_10 = 5;
        }
        else {
          sVar5 = ByteString::size((ByteString *)0x168818);
          if (sVar5 != 0) {
            __src = ByteString::byte_str(this);
            sVar5 = ByteString::size((ByteString *)0x168858);
            memcpy(local_30,__src,sVar5);
          }
          sVar5 = ByteString::size((ByteString *)0x168880);
          *local_38 = sVar5;
          local_10 = 0;
        }
      }
      ByteString::~ByteString((ByteString *)0x1688bb);
      ByteString::~ByteString((ByteString *)0x1688c8);
    }
  }
  return local_10;
}

Assistant:

static CK_RV SymEncryptUpdate(Session* session, CK_BYTE_PTR pData, CK_ULONG ulDataLen, CK_BYTE_PTR pEncryptedData, CK_ULONG_PTR pulEncryptedDataLen)
{
	SymmetricAlgorithm* cipher = session->getSymmetricCryptoOp();
	if (cipher == NULL || !session->getAllowMultiPartOp())
	{
		session->resetOp();
		return CKR_OPERATION_NOT_INITIALIZED;
	}

	// Check data size
	size_t blockSize = cipher->getBlockSize();
	size_t remainingSize = cipher->getBufferSize();
	CK_ULONG maxSize = ulDataLen + remainingSize;
	if (cipher->isBlockCipher())
	{
		int nrOfBlocks = (ulDataLen + remainingSize) / blockSize;
		maxSize = nrOfBlocks * blockSize;
	}
	if (!cipher->checkMaximumBytes(ulDataLen))
	{
		session->resetOp();
		return CKR_DATA_LEN_RANGE;
	}

	// Check data size
	if (pEncryptedData == NULL_PTR)
	{
		*pulEncryptedDataLen = maxSize;
		return CKR_OK;
	}

	// Check output buffer size
	if (*pulEncryptedDataLen < maxSize)
	{
		DEBUG_MSG("ulDataLen: %#5x  output buffer size: %#5x  blockSize: %#3x  remainingSize: %#4x  maxSize: %#5x",
			  ulDataLen, *pulEncryptedDataLen, blockSize, remainingSize, maxSize);
		*pulEncryptedDataLen = maxSize;
		return CKR_BUFFER_TOO_SMALL;
	}

	// Get the data
	ByteString data(pData, ulDataLen);
	ByteString encryptedData;

	// Encrypt the data
	if (!cipher->encryptUpdate(data, encryptedData))
	{
		session->resetOp();
		return CKR_GENERAL_ERROR;
	}
	DEBUG_MSG("ulDataLen: %#5x  output buffer size: %#5x  blockSize: %#3x  remainingSize: %#4x  maxSize: %#5x  encryptedData.size(): %#5x",
		  ulDataLen, *pulEncryptedDataLen, blockSize, remainingSize, maxSize, encryptedData.size());

	// Check output size from crypto. Unrecoverable error if to large.
	if (*pulEncryptedDataLen < encryptedData.size())
	{
		session->resetOp();
		ERROR_MSG("EncryptUpdate returning too much data. Length of output data buffer is %i but %i bytes was returned by the encrypt.",
			  *pulEncryptedDataLen, encryptedData.size());
		return CKR_GENERAL_ERROR;
	}

	if (encryptedData.size() > 0)
	{
		memcpy(pEncryptedData, encryptedData.byte_str(), encryptedData.size());
	}
	*pulEncryptedDataLen = encryptedData.size();

	return CKR_OK;
}